

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm,
                 ZSTD_tableFillPurpose_e tfp)

{
  BYTE *iend;
  ZSTD_paramSwitch_e ZVar1;
  int iVar2;
  BYTE *pBVar3;
  U32 UVar4;
  U32 UVar5;
  uint uVar6;
  ulong uVar7;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  undefined4 extraout_var;
  byte bVar8;
  uint uVar9;
  BYTE *pBVar10;
  int iVar11;
  ulong uVar12;
  BYTE *ip;
  long lVar13;
  BYTE *ip_00;
  bool bVar14;
  
  iend = (BYTE *)((long)src + srcSize);
  ZVar1 = (params->ldmParams).enableLdm;
  bVar14 = (params->cParams).strategy - ZSTD_fast < 2;
  lVar13 = -0xdffffffe;
  if (tfp == ZSTD_tfp_forCDict && bVar14) {
    lVar13 = -0xfffffe;
  }
  uVar12 = 0xdffffffe;
  if (tfp == ZSTD_tfp_forCDict && bVar14) {
    uVar12 = 0xfffffe;
  }
  ip_00 = iend + lVar13;
  if (srcSize <= uVar12) {
    ip_00 = (BYTE *)src;
    uVar12 = srcSize;
  }
  if (srcSize != 0) {
    pBVar3 = (ms->window).nextSrc;
    if (pBVar3 != ip_00) {
      pBVar10 = (ms->window).base;
      lVar13 = (long)pBVar3 - (long)pBVar10;
      UVar5 = (ms->window).dictLimit;
      (ms->window).lowLimit = UVar5;
      UVar4 = (U32)lVar13;
      (ms->window).dictLimit = UVar4;
      (ms->window).dictBase = pBVar10;
      (ms->window).base = ip_00 + -lVar13;
      if (UVar4 - UVar5 < 8) {
        (ms->window).lowLimit = UVar4;
      }
    }
    pBVar10 = ip_00 + uVar12;
    (ms->window).nextSrc = pBVar10;
    pBVar3 = (ms->window).dictBase;
    uVar6 = (ms->window).dictLimit;
    if (ip_00 < pBVar3 + uVar6 && pBVar3 + (ms->window).lowLimit < pBVar10) {
      uVar9 = (uint)((long)pBVar10 - (long)pBVar3);
      if ((long)(ulong)uVar6 < (long)pBVar10 - (long)pBVar3) {
        uVar9 = uVar6;
      }
      (ms->window).lowLimit = uVar9;
    }
  }
  iVar11 = (int)iend;
  if (ls != (ldmState_t *)0x0 && ZVar1 == ZSTD_ps_enable) {
    if (srcSize != 0) {
      pBVar3 = (ls->window).nextSrc;
      if (pBVar3 != ip_00) {
        pBVar10 = (ls->window).base;
        lVar13 = (long)pBVar3 - (long)pBVar10;
        UVar5 = (ls->window).dictLimit;
        (ls->window).lowLimit = UVar5;
        UVar4 = (U32)lVar13;
        (ls->window).dictLimit = UVar4;
        (ls->window).dictBase = pBVar10;
        (ls->window).base = ip_00 + -lVar13;
        if (UVar4 - UVar5 < 8) {
          (ls->window).lowLimit = UVar4;
        }
      }
      pBVar10 = ip_00 + uVar12;
      (ls->window).nextSrc = pBVar10;
      pBVar3 = (ls->window).dictBase;
      uVar6 = (ls->window).dictLimit;
      if (ip_00 < pBVar3 + uVar6 && pBVar3 + (ls->window).lowLimit < pBVar10) {
        uVar9 = (uint)((long)pBVar10 - (long)pBVar3);
        if ((long)(ulong)uVar6 < (long)pBVar10 - (long)pBVar3) {
          uVar9 = uVar6;
        }
        (ls->window).lowLimit = uVar9;
      }
    }
    UVar5 = 0;
    if (params->forceWindow == 0) {
      UVar5 = iVar11 - *(int *)&(ls->window).base;
    }
    ls->loadedDictEnd = UVar5;
    ZSTD_ldm_fillHashTable(ls,ip_00,iend,&params->ldmParams);
  }
  if ((int)(params->cParams).strategy < 8) {
    uVar6 = (params->cParams).chainLog;
    uVar9 = (params->cParams).hashLog;
    if (uVar6 < uVar9) {
      uVar6 = uVar9;
    }
    bVar8 = 0x1c;
    if (uVar6 < 0x1c) {
      bVar8 = (byte)uVar6;
    }
    uVar7 = (ulong)(uint)(8 << (bVar8 & 0x1f));
    if (uVar7 < uVar12) {
      ip_00 = iend + -uVar7;
    }
    if (uVar7 <= uVar12) {
      uVar12 = uVar7;
    }
  }
  iVar2 = *(int *)&(ms->window).base;
  ms->nextToUpdate = (int)ip_00 - iVar2;
  UVar5 = 0;
  if (params->forceWindow == 0) {
    UVar5 = iVar11 - iVar2;
  }
  ms->loadedDictEnd = UVar5;
  uVar7 = (ulong)(uint)params->deterministicRefPrefix;
  ms->forceNonContiguous = params->deterministicRefPrefix;
  if (8 < uVar12) {
    ZSTD_overflowCorrectIfNeeded(ms,ws,params,ip_00,iend);
    uVar7 = (ulong)((params->cParams).strategy - ZSTD_fast);
    switch(uVar7) {
    case 0:
      ZSTD_fillHashTable(ms,iend,dtlm,tfp);
      uVar7 = extraout_RAX_02;
      break;
    case 1:
      ZSTD_fillDoubleHashTable(ms,iend,dtlm,tfp);
      uVar7 = extraout_RAX_03;
      break;
    case 2:
    case 3:
    case 4:
      if (ms->dedicatedDictSearch == 0) {
        if (params->useRowMatchFinder == ZSTD_ps_enable) {
          switchD_0105b559::default(ms->tagTable,0,1L << ((byte)(params->cParams).hashLog & 0x3f));
          ZSTD_row_update(ms,iend + -8);
          uVar7 = extraout_RAX_01;
        }
        else {
          UVar5 = ZSTD_insertAndFindFirstIndex(ms,iend + -8);
          uVar7 = CONCAT44(extraout_var,UVar5);
        }
      }
      else {
        ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms,iend + -8);
        uVar7 = extraout_RAX_00;
      }
      break;
    case 5:
    case 6:
    case 7:
    case 8:
      ZSTD_updateTree(ms,iend + -8,iend);
      uVar7 = extraout_RAX;
    }
    ms->nextToUpdate = iVar11 - *(int *)&(ms->window).base;
  }
  return uVar7;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm,
                                         ZSTD_tableFillPurpose_e tfp)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm == ZSTD_ps_enable && ls != NULL;

    /* Assert that the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    {   /* Ensure large dictionaries can't cause index overflow */

        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 maxDictSize = ZSTD_CURRENT_MAX - ZSTD_WINDOW_START_INDEX;

        int const CDictTaggedIndices = ZSTD_CDictIndicesAreTagged(&params->cParams);
        if (CDictTaggedIndices && tfp == ZSTD_tfp_forCDict) {
            /* Some dictionary matchfinders in zstd use "short cache",
             * which treats the lower ZSTD_SHORT_CACHE_TAG_BITS of each
             * CDict hashtable entry as a tag rather than as part of an index.
             * When short cache is used, we need to truncate the dictionary
             * so that its indices don't overlap with the tag. */
            U32 const shortCacheMaxDictSize = (1u << (32 - ZSTD_SHORT_CACHE_TAG_BITS)) - ZSTD_WINDOW_START_INDEX;
            maxDictSize = MIN(maxDictSize, shortCacheMaxDictSize);
            assert(!loadLdmDict);
        }

        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict) assert(ZSTD_window_isEmpty(ls->window));
    }
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);

    if (loadLdmDict) { /* Load the entire dict into LDM matchfinders. */
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);
    }

    /* If the dict is larger than we can reasonably index in our tables, only load the suffix. */
    if (params->cParams.strategy < ZSTD_btultra) {
        U32 maxDictSize = 8U << MIN(MAX(params->cParams.hashLog, params->cParams.chainLog), 28);
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    ms->nextToUpdate = (U32)(ip - ms->window.base);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm, tfp);
        break;
    case ZSTD_dfast:
#ifndef ZSTD_EXCLUDE_DFAST_BLOCK_COMPRESSOR
        ZSTD_fillDoubleHashTable(ms, iend, dtlm, tfp);
#else
        assert(0); /* shouldn't be called: cparams should've been adjusted. */
#endif
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
#if !defined(ZSTD_EXCLUDE_GREEDY_BLOCK_COMPRESSOR) \
 || !defined(ZSTD_EXCLUDE_LAZY_BLOCK_COMPRESSOR) \
 || !defined(ZSTD_EXCLUDE_LAZY2_BLOCK_COMPRESSOR)
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_ps_auto);
            if (params->useRowMatchFinder == ZSTD_ps_enable) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
#else
        assert(0); /* shouldn't be called: cparams should've been adjusted. */
#endif
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
#if !defined(ZSTD_EXCLUDE_BTLAZY2_BLOCK_COMPRESSOR) \
 || !defined(ZSTD_EXCLUDE_BTOPT_BLOCK_COMPRESSOR) \
 || !defined(ZSTD_EXCLUDE_BTULTRA_BLOCK_COMPRESSOR)
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
#else
        assert(0); /* shouldn't be called: cparams should've been adjusted. */
#endif
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}